

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Maybe<kj::Own<const_kj::File>_> __thiscall
kj::anon_unknown_8::DiskDirectory::tryOpenFile(DiskDirectory *this,PathPtr path,WriteMode mode)

{
  Maybe<kj::Own<const_kj::File>_> MVar1;
  PathPtr path_00;
  WriteMode mode_local;
  DiskDirectory *this_local;
  PathPtr path_local;
  
  path_00.parts.size_ = path.parts.size_;
  path_00.parts.ptr = &((path.parts.ptr)->content).size_;
  MVar1 = DiskHandle::tryOpenFile((DiskHandle *)this,path_00,mode);
  MVar1.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::File>_>)MVar1.ptr;
}

Assistant:

Maybe<Own<const File>> tryOpenFile(PathPtr path, WriteMode mode) const override {
    return DiskHandle::tryOpenFile(path, mode);
  }